

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void update_golden_frame_stats(AV1_COMP *cpi)

{
  RATE_CONTROL *rc;
  AV1_COMP *cpi_local;
  
  if ((((cpi->refresh_frame).golden_frame & 1U) == 0) && ((cpi->rc).is_src_frame_alt_ref == 0)) {
    if ((cpi->common).show_frame != 0) {
      (cpi->rc).frames_since_golden = (cpi->rc).frames_since_golden + 1;
    }
  }
  else {
    (cpi->rc).frames_since_golden = 0;
  }
  return;
}

Assistant:

static void update_golden_frame_stats(AV1_COMP *cpi) {
  RATE_CONTROL *const rc = &cpi->rc;

  // Update the Golden frame usage counts.
  if (cpi->refresh_frame.golden_frame || rc->is_src_frame_alt_ref) {
    rc->frames_since_golden = 0;
  } else if (cpi->common.show_frame) {
    rc->frames_since_golden++;
  }
}